

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_cmd_send(void *ctx)

{
  uint uVar1;
  RK_S32 RVar2;
  MppReqV1 *pMVar3;
  long lVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  MPP_RET *pMVar8;
  int local_54;
  RK_S32 i;
  MppReqV1 *mpp_req_2;
  MppReqV1 *mpp_req_1;
  MppReqV1 mpp_req;
  MppDevMppService *p;
  MPP_RET ret;
  void *ctx_local;
  
  mpp_req.data_ptr = (RK_U64)ctx;
  if ((*(int *)((long)ctx + 0x34) < 1) || (*(int *)((long)ctx + 0x30) < *(int *)((long)ctx + 0x34)))
  {
    _mpp_log_l(2,"mpp_serivce","ctx %p invalid request count %d\n","mpp_service_cmd_send",ctx,
               (ulong)*(uint *)((long)ctx + 0x34));
    ctx_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if (*(int *)((long)ctx + 0x78) != 0) {
      if (*(int *)((long)ctx + 0x188) != 0) {
        mpp_req_1._0_4_ = 0x403;
        mpp_req_1._4_4_ = 2;
        mpp_req.cmd = *(int *)((long)ctx + 0x78) << 4;
        mpp_req.flag = 0;
        mpp_req._8_8_ = (long)ctx + 0x80;
        RVar2 = mpp_service_ioctl_request(*(RK_S32 *)((long)ctx + 4),(MppReqV1 *)&mpp_req_1);
        if (RVar2 != 0) {
          *(undefined4 *)(mpp_req.data_ptr + 0x188) = 0;
        }
      }
      *(undefined4 *)(mpp_req.data_ptr + 0x78) = 0;
    }
    if (*(int *)(mpp_req.data_ptr + 0x44) != 0) {
      pMVar3 = mpp_service_next_req((MppDevMppService *)mpp_req.data_ptr);
      pMVar3->cmd = 0x202;
      pMVar3->flag = 0x10;
      pMVar3->size = *(int *)(mpp_req.data_ptr + 0x44) << 3;
      pMVar3->offset = 0;
      pMVar3->data_ptr =
           *(long *)(mpp_req.data_ptr + 0x38) + (long)*(int *)(mpp_req.data_ptr + 0x48) * 8;
      *(int *)(mpp_req.data_ptr + 0x48) =
           *(int *)(mpp_req.data_ptr + 0x44) + *(int *)(mpp_req.data_ptr + 0x48);
    }
    if (*(int *)(mpp_req.data_ptr + 0x5c) != 0) {
      pMVar3 = mpp_service_next_req((MppDevMppService *)mpp_req.data_ptr);
      pMVar3->cmd = 0x203;
      pMVar3->flag = 0;
      pMVar3->size = *(int *)(mpp_req.data_ptr + 0x5c) << 3;
      pMVar3->offset = 0;
      pMVar3->data_ptr =
           *(long *)(mpp_req.data_ptr + 0x50) + (long)*(int *)(mpp_req.data_ptr + 0x60) * 8;
      *(int *)(mpp_req.data_ptr + 0x60) =
           *(int *)(mpp_req.data_ptr + 0x5c) + *(int *)(mpp_req.data_ptr + 0x60);
    }
    if (1 < *(int *)(mpp_req.data_ptr + 0x34)) {
      for (local_54 = 0; local_54 < *(int *)(mpp_req.data_ptr + 0x34); local_54 = local_54 + 1) {
        lVar4 = *(long *)(mpp_req.data_ptr + 0x28) + (long)local_54 * 0x18;
        *(uint *)(lVar4 + 4) = *(uint *)(lVar4 + 4) | 1;
      }
    }
    lVar4 = *(long *)(mpp_req.data_ptr + 0x28) +
            (long)(*(int *)(mpp_req.data_ptr + 0x34) + -1) * 0x18;
    *(uint *)(lVar4 + 4) = *(uint *)(lVar4 + 4) | 0x12;
    if (*(int *)(mpp_req.data_ptr + 0x18) == 0) {
      p._4_4_ = mpp_service_ioctl_request
                          (*(RK_S32 *)(mpp_req.data_ptr + 8),*(MppReqV1 **)(mpp_req.data_ptr + 0x28)
                          );
      if (p._4_4_ != MPP_OK) {
        puVar5 = (uint *)__errno_location();
        uVar1 = *puVar5;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        _mpp_log_l(2,"mpp_serivce","ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                   "mpp_service_cmd_send",(ulong)(uint)p._4_4_,(ulong)uVar1,pcVar7);
        pMVar8 = __errno_location();
        p._4_4_ = *pMVar8;
      }
    }
    else {
      p._4_4_ = mpp_server_send_task(ctx);
      if (p._4_4_ != MPP_OK) {
        _mpp_log_l(2,"mpp_serivce","send task to server ret %d\n","mpp_service_cmd_send",
                   (ulong)(uint)p._4_4_);
      }
    }
    *(undefined4 *)(mpp_req.data_ptr + 0x34) = 0;
    *(undefined4 *)(mpp_req.data_ptr + 0x44) = 0;
    *(undefined4 *)(mpp_req.data_ptr + 0x48) = 0;
    *(undefined4 *)(mpp_req.data_ptr + 0x5c) = 0;
    *(undefined4 *)(mpp_req.data_ptr + 0x60) = 0;
    *(undefined4 *)(mpp_req.data_ptr + 0x5c) = 0;
    ctx_local._4_4_ = p._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_service_cmd_send(void *ctx)
{
    MPP_RET ret = MPP_OK;
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (p->req_cnt <= 0 || p->req_cnt > p->req_max) {
        mpp_err_f("ctx %p invalid request count %d\n", ctx, p->req_cnt);
        return MPP_ERR_VALUE;
    }

    if (p->info_count) {
        if (p->support_set_info) {
            MppReqV1 mpp_req;

            mpp_req.cmd = MPP_CMD_SEND_CODEC_INFO;
            mpp_req.flag = MPP_FLAGS_LAST_MSG;
            mpp_req.size = p->info_count * sizeof(p->info[0]);
            mpp_req.offset = 0;
            mpp_req.data_ptr = REQ_DATA_PTR(p->info);

            ret = mpp_service_ioctl_request(p->client, &mpp_req);
            if (ret)
                p->support_set_info = 0;
        }
        p->info_count = 0;
    }

    /* set fd trans info if needed */
    if (p->reg_offset_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
        mpp_req->flag = MPP_FLAGS_REG_OFFSET_ALONE;
        mpp_req->size = (p->reg_offset_count) * sizeof(RegOffsetInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->reg_offset_info[p->reg_offset_pos]);
        p->reg_offset_pos += p->reg_offset_count;
    }

    /* set rcb offst info if needed */
    if (p->rcb_count) {
        MppReqV1 *mpp_req = mpp_service_next_req(p);

        mpp_req->cmd = MPP_CMD_SET_RCB_INFO;
        mpp_req->flag = 0;
        mpp_req->size = p->rcb_count * sizeof(RcbInfo);
        mpp_req->offset = 0;
        mpp_req->data_ptr = REQ_DATA_PTR(&p->rcb_info[p->rcb_pos]);
        p->rcb_pos += p->rcb_count;
    }

    /* setup flag for multi message request */
    if (p->req_cnt > 1) {
        RK_S32 i;

        for (i = 0; i < p->req_cnt; i++)
            p->reqs[i].flag |= MPP_FLAGS_MULTI_MSG;
    }
    p->reqs[p->req_cnt - 1].flag |=  MPP_FLAGS_LAST_MSG | MPP_FLAGS_REG_OFFSET_ALONE;

    if (p->batch_io) {
        ret = mpp_server_send_task(ctx);
        if (ret)
            mpp_err_f("send task to server ret %d\n", ret);
    } else {
        ret = mpp_service_ioctl_request(p->server, &p->reqs[0]);
        if (ret) {
            mpp_err_f("ioctl MPP_IOC_CFG_V1 failed ret %d errno %d %s\n",
                      ret, errno, strerror(errno));
            ret = errno;
        }
    }

    p->req_cnt = 0;
    p->reg_offset_count = 0;
    p->reg_offset_pos = 0;
    p->rcb_count = 0;
    p->rcb_pos = 0;
    p->rcb_count = 0;
    return ret;
}